

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-regex.c
# Opt level: O3

void process_regex(char *find_text,char *regex_text)

{
  basic_matchlist_t match_list;
  regex_t regex;
  basic_matchlist_t bStack_68;
  regex_t local_58;
  
  regex_compile(&local_58,regex_text);
  basic_matchlist_init(&bStack_68);
  regex_match(&local_58,find_text,&bStack_68);
  basic_matchlist_print(&bStack_68);
  basic_matchlist_delete(&bStack_68);
  regfree((regex_t *)&local_58);
  return;
}

Assistant:

void process_regex(const char* find_text, const char* regex_text)
{
    regex_t regex;
    basic_matchlist_t match_list;
    regex_compile (&regex, regex_text);
    basic_matchlist_init(&match_list);
    regex_match (&regex, find_text, &match_list);
    basic_matchlist_print(&match_list);
    basic_matchlist_delete(&match_list);
    regfree (&regex);
}